

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

void Ssw_SmlSavePatternAigPhase(Ssw_Man_t *p,int f)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  int iVar6;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  pVVar1 = p->pAig->vCis;
  iVar6 = pVVar1->nSize;
  if (0 < iVar6) {
    ppvVar2 = pVVar1->pArray;
    ppAVar3 = p->pNodeToFrames;
    uVar5 = 0;
    do {
      pAVar4 = ppAVar3[*(int *)((long)ppvVar2[uVar5] + 0x24) * p->nFrames + f];
      if ((pAVar4 == (Aig_Obj_t *)0x0) ||
         ((((uint)pAVar4 ^ *(uint *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0))
      {
        p->pPatWords[uVar5 >> 5 & 0x7ffffff] =
             p->pPatWords[uVar5 >> 5 & 0x7ffffff] | 1 << ((byte)uVar5 & 0x1f);
        iVar6 = pVVar1->nSize;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)iVar6);
  }
  return;
}

Assistant:

void Ssw_SmlSavePatternAigPhase( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pAig, pObj, i )
        if ( Aig_ObjPhaseReal( Ssw_ObjFrame(p, pObj, f) ) )
            Abc_InfoSetBit( p->pPatWords, i );
}